

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_gsub(lua_State *L)

{
  char cVar1;
  int tr_00;
  uint uVar2;
  lua_Integer lVar3;
  char *e_00;
  char *e;
  luaL_Buffer b;
  MatchState ms;
  long lStack_58;
  int changed;
  lua_Integer n;
  int anchor;
  lua_Integer max_s;
  char *pcStack_38;
  int tr;
  char *lastmatch;
  char *p;
  char *src;
  size_t lp;
  size_t srcl;
  lua_State *L_local;
  
  srcl = (size_t)L;
  p = luaL_checklstring(L,1,&lp);
  lastmatch = luaL_checklstring((lua_State *)srcl,2,(size_t *)&src);
  pcStack_38 = (char *)0x0;
  tr_00 = lua_type((lua_State *)srcl,3);
  lVar3 = luaL_optinteger((lua_State *)srcl,4,lp + 1);
  cVar1 = *lastmatch;
  lStack_58 = 0;
  ms.capture[0x1f].len._4_4_ = 0;
  if ((((tr_00 != 3) && (tr_00 != 4)) && (tr_00 != 6)) && (tr_00 != 5)) {
    luaL_typeerror((lua_State *)srcl,3,"string/function/table");
  }
  luaL_buffinit((lua_State *)srcl,(luaL_Buffer *)&e);
  if (cVar1 == '^') {
    lastmatch = lastmatch + 1;
    src = src + -1;
  }
  prepstate((MatchState *)(b.initb + 0x1ff8),(lua_State *)srcl,p,lp,lastmatch,(size_t)src);
  do {
    if (lVar3 <= lStack_58) break;
    reprepstate((MatchState *)(b.initb + 0x1ff8));
    e_00 = match((MatchState *)(b.initb + 0x1ff8),p,lastmatch);
    if ((e_00 == (char *)0x0) || (e_00 == pcStack_38)) {
      if (ms.src_init <= p) break;
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)&e,1);
      }
      e[b.size] = *p;
      b.size = b.size + 1;
      p = p + 1;
    }
    else {
      lStack_58 = lStack_58 + 1;
      uVar2 = add_value((MatchState *)(b.initb + 0x1ff8),(luaL_Buffer *)&e,p,e_00,tr_00);
      ms.capture[0x1f].len._4_4_ = uVar2 | ms.capture[0x1f].len._4_4_;
      pcStack_38 = e_00;
      p = e_00;
    }
  } while (cVar1 != '^');
  if (ms.capture[0x1f].len._4_4_ == 0) {
    lua_pushvalue((lua_State *)srcl,1);
  }
  else {
    luaL_addlstring((luaL_Buffer *)&e,p,(long)ms.src_init - (long)p);
    luaL_pushresult((luaL_Buffer *)&e);
  }
  lua_pushinteger((lua_State *)srcl,lStack_58);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
  const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
  const char *lastmatch = NULL;  /* end of last match */
  int tr = lua_type(L, 3);  /* replacement type */
  lua_Integer max_s = luaL_optinteger(L, 4, srcl + 1);  /* max replacements */
  int anchor = (*p == '^');
  lua_Integer n = 0;  /* replacement count */
  int changed = 0;  /* change flag */
  MatchState ms;
  luaL_Buffer b;
  luaL_argexpected(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  prepstate(&ms, L, src, srcl, p, lp);
  while (n < max_s) {
    const char *e;
    reprepstate(&ms);  /* (re)prepare state for new match */
    if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
      n++;
      changed = add_value(&ms, &b, src, e, tr) | changed;
      src = lastmatch = e;
    }
    else if (src < ms.src_end)  /* otherwise, skip one character */
      luaL_addchar(&b, *src++);
    else break;  /* end of subject */
    if (anchor) break;
  }
  if (!changed)  /* no changes? */
    lua_pushvalue(L, 1);  /* return original string */
  else {  /* something changed */
    luaL_addlstring(&b, src, ms.src_end-src);
    luaL_pushresult(&b);  /* create and return new string */
  }
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}